

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::pushKVs(UniValue *this,UniValue obj)

{
  long lVar1;
  string key;
  reference __str;
  reference pvVar2;
  VType VVar3;
  UniValue *in_RSI;
  ulong __n;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  UniValue in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VVar3 = VOBJ;
  checkType(this,(VType *)&stack0xffffffffffffff4c);
  checkType(in_RSI,(VType *)&stack0xffffffffffffff4c);
  for (__n = 0; __n < (ulong)((long)(in_RSI->keys).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in_RSI->keys).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&in_RSI->keys,__n);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,__str);
    pvVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&in_RSI->values,__n);
    UniValue((UniValue *)&stack0xffffffffffffff50,pvVar2);
    key._M_string_length = (size_type)this;
    key._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff38;
    key.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffff48;
    key.field_2._M_allocated_capacity._4_4_ = VVar3;
    key.field_2._8_8_ = in_stack_ffffffffffffff50;
    pushKVEnd(this,key,in_stack_ffffffffffffff58);
    ~UniValue((UniValue *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKVs(UniValue obj)
{
    checkType(VOBJ);
    obj.checkType(VOBJ);

    for (size_t i = 0; i < obj.keys.size(); i++)
        pushKVEnd(std::move(obj.keys.at(i)), std::move(obj.values.at(i)));
}